

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteCollectionPut(unqlite_col *pCol,jx9_value *pValue,int iFlag)

{
  int iVar1;
  int rc;
  int iFlag_local;
  jx9_value *pValue_local;
  unqlite_col *pCol_local;
  
  iVar1 = jx9_value_is_json_object(pValue);
  if ((iVar1 == 0) && (iVar1 = jx9_value_is_json_array(pValue), iVar1 != 0)) {
    iVar1 = jx9_array_walk(pValue,CollectionRecordArrayWalker,pCol);
    return iVar1;
  }
  iVar1 = CollectionStore(pCol,pValue);
  return iVar1;
}

Assistant:

UNQLITE_PRIVATE int unqliteCollectionPut(unqlite_col *pCol,jx9_value *pValue,int iFlag)
{
	int rc;
	if( !jx9_value_is_json_object(pValue) && jx9_value_is_json_array(pValue) ){
		/* Iterate over the array and store its members in the collection */
		rc = jx9_array_walk(pValue,CollectionRecordArrayWalker,pCol);
		SXUNUSED(iFlag); /* cc warning */
	}else{
		rc = CollectionStore(pCol,pValue);
	}
	return rc;
}